

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctobin.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int maxsampleindex;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  maxsampleindex = -1;
  while( true ) {
    iVar1 = getopt(argc,argv,"vhS:");
    if (iVar1 != 0x53) break;
    maxsampleindex = atoi(_optarg);
  }
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_48,"",&local_69);
    std::__cxx11::string::string((string *)&local_68,"",&local_6a);
    initstreams(&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    if (maxsampleindex != -1) {
      doit(maxsampleindex);
      return 0;
    }
    fwrite("FATAL: Sample size not supplied - please use -s parameter followed by the sample size\n"
           ,0x56,1,_stderr);
  }
  else if (iVar1 == 0x76) {
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
  }
  else {
    help();
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	int maxsampleindex = -1;
	while ((opt = getopt(argc, argv, (char *) "vhS:")) != -1) {
		switch (opt) {
		case 'S':
			maxsampleindex = atoi(optarg);
			break;

		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;

		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	initstreams();
	if (maxsampleindex == -1) {
		fprintf(stderr, "FATAL: Sample size not supplied - please use -s parameter followed by the sample size\n");
			exit(EXIT_FAILURE);
	}

	doit(maxsampleindex);

	return EXIT_SUCCESS;

}